

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
ModbusSimulationDataGenerator::CreateModbusByte(ModbusSimulationDataGenerator *this,U64 value)

{
  ParityAndStopbits PVar1;
  ModbusAnalyzerSettings *pMVar2;
  uint uVar3;
  BitState BVar4;
  ulong uVar5;
  bool bVar6;
  BitExtractor bit_extractor;
  BitExtractor aBStack_38 [8];
  
  BVar4 = (int)this + 0x30;
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar4);
  pMVar2 = this->mSettings;
  uVar5 = value ^ -(ulong)pMVar2->mInverted;
  uVar3 = pMVar2->mBitsPerTransfer + (uint)(pMVar2->mModbusMode - MpModeMsbZeroMeansAddress < 2);
  BitExtractor::BitExtractor(aBStack_38,uVar5,pMVar2->mShiftOrder,uVar3);
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(BVar4);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(BVar4);
  }
  PVar1 = this->mSettings->mParity;
  if (PVar1 == EvenOne) {
    uVar3 = AnalyzerHelpers::GetOnesCount(uVar5);
    AnalyzerHelpers::IsEven((ulong)uVar3);
  }
  else {
    if (PVar1 != OddOne) goto LAB_00118277;
    uVar3 = AnalyzerHelpers::GetOnesCount(uVar5);
    AnalyzerHelpers::IsOdd((ulong)uVar3);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(BVar4);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar4);
LAB_00118277:
  SimulationChannelDescriptor::TransitionIfNeeded(BVar4);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar4);
  if (this->mSettings->mParity == NoneTwo) {
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(BVar4);
  }
  BitExtractor::~BitExtractor(aBStack_38);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::CreateModbusByte( U64 value )
{
    // assume we start high
    mModbusSimulationData.Transition();                                     // low-going edge for start bit
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() ); // add start bit time

    if( mSettings->mInverted == true )
        value = ~value;

    U32 num_bits = mSettings->mBitsPerTransfer;
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::MpModeMsbOneMeansAddress ||
        mSettings->mModbusMode == ModbusAnalyzerEnums::MpModeMsbZeroMeansAddress )
        num_bits++;

    BitExtractor bit_extractor( value, mSettings->mShiftOrder, num_bits );

    for( U32 i = 0; i < num_bits; i++ )
    {
        mModbusSimulationData.TransitionIfNeeded( bit_extractor.GetNextBit() );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity == ModbusAnalyzerEnums::EvenOne )
    {
        if( AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mModbusSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mModbusSimulationData.TransitionIfNeeded( mBitHigh ); // we want to add a one bit

        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }
    else if( mSettings->mParity == ModbusAnalyzerEnums::OddOne )
    {
        if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mModbusSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mModbusSimulationData.TransitionIfNeeded( mBitHigh );

        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    mModbusSimulationData.TransitionIfNeeded( mBitHigh ); // we need to end high

    // lets pad the end a bit for the stop bit:
    // we're still using these old settings becuase it's not worth it right now to tear them all out.
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );

    if( mSettings->mParity == ModbusAnalyzerEnums::NoneTwo )
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
}